

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::CompactReporter::printTotals(CompactReporter *this,Totals *totals)

{
  size_t sVar1;
  size_t sVar2;
  ostream *poVar3;
  ostream *poVar4;
  allocator local_2d9;
  string local_2d8 [32];
  pluralise local_2b8;
  allocator local_289;
  string local_288 [32];
  pluralise local_268;
  undefined1 local_240 [39];
  allocator local_219;
  string local_218 [6];
  Colour colour_2;
  pluralise local_1f8;
  allocator local_1c9;
  string local_1c8 [32];
  pluralise local_1a8;
  Colour local_17a;
  allocator local_179;
  string local_178 [6];
  Colour colour_1;
  pluralise local_158;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  pluralise local_e8;
  allocator local_b9;
  string local_b8 [32];
  pluralise local_98;
  undefined1 local_70 [48];
  undefined1 local_40 [8];
  string qualify_assertions_failed;
  Colour local_19;
  Totals *pTStack_18;
  Colour colour;
  Totals *totals_local;
  CompactReporter *this_local;
  
  pTStack_18 = totals;
  sVar1 = Counts::total(&totals->testCases);
  if (sVar1 == 0) {
    std::operator<<((ostream *)(this->super_StreamingReporterBase).stream,"No tests ran.");
  }
  else {
    sVar1 = (pTStack_18->testCases).failed;
    sVar2 = Counts::total(&pTStack_18->testCases);
    if (sVar1 == sVar2) {
      Colour::Colour(&local_19,BrightRed);
      sVar1 = (pTStack_18->assertions).failed;
      sVar2 = Counts::total(&pTStack_18->assertions);
      local_70[0x22] = 0;
      if (sVar1 == sVar2) {
        bothOrAll_abi_cxx11_((CompactReporter *)local_40,(size_t)this);
      }
      else {
        std::allocator<char>::allocator();
        local_70[0x22] = 1;
        std::__cxx11::string::string((string *)local_40,"",(allocator *)(local_70 + 0x23));
      }
      if ((local_70[0x22] & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(local_70 + 0x23));
      }
      poVar3 = std::operator<<((ostream *)(this->super_StreamingReporterBase).stream,"Failed ");
      bothOrAll_abi_cxx11_((CompactReporter *)local_70,(size_t)this);
      poVar3 = std::operator<<(poVar3,(string *)local_70);
      sVar1 = (pTStack_18->testCases).failed;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"test case",&local_b9);
      pluralise::pluralise(&local_98,sVar1,(string *)local_b8);
      poVar4 = Catch::operator<<((ostream *)poVar3,&local_98);
      poVar3 = std::operator<<((ostream *)poVar4,", failed ");
      poVar3 = std::operator<<(poVar3,(string *)local_40);
      sVar1 = (pTStack_18->assertions).failed;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"assertion",&local_109);
      pluralise::pluralise(&local_e8,sVar1,(string *)local_108);
      poVar4 = Catch::operator<<((ostream *)poVar3,&local_e8);
      std::operator<<((ostream *)poVar4,".");
      pluralise::~pluralise(&local_e8);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      pluralise::~pluralise(&local_98);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      std::__cxx11::string::~string((string *)local_70);
      std::__cxx11::string::~string((string *)local_40);
      Colour::~Colour(&local_19);
    }
    else {
      sVar1 = Counts::total(&pTStack_18->assertions);
      if (sVar1 == 0) {
        poVar3 = std::operator<<((ostream *)(this->super_StreamingReporterBase).stream,"Passed ");
        Counts::total(&pTStack_18->testCases);
        bothOrAll_abi_cxx11_((CompactReporter *)local_130,(size_t)this);
        poVar3 = std::operator<<(poVar3,local_130);
        sVar1 = Counts::total(&pTStack_18->testCases);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_178,"test case",&local_179);
        pluralise::pluralise(&local_158,sVar1,(string *)local_178);
        poVar4 = Catch::operator<<((ostream *)poVar3,&local_158);
        std::operator<<((ostream *)poVar4," (no assertions).");
        pluralise::~pluralise(&local_158);
        std::__cxx11::string::~string(local_178);
        std::allocator<char>::~allocator((allocator<char> *)&local_179);
        std::__cxx11::string::~string(local_130);
      }
      else if ((pTStack_18->assertions).failed == 0) {
        Colour::Colour((Colour *)(local_240 + 0x26),BrightGreen);
        poVar3 = std::operator<<((ostream *)(this->super_StreamingReporterBase).stream,"Passed ");
        bothOrAll_abi_cxx11_((CompactReporter *)local_240,(size_t)this);
        poVar3 = std::operator<<(poVar3,(string *)local_240);
        sVar1 = (pTStack_18->testCases).passed;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_288,"test case",&local_289);
        pluralise::pluralise(&local_268,sVar1,(string *)local_288);
        poVar4 = Catch::operator<<((ostream *)poVar3,&local_268);
        poVar3 = std::operator<<((ostream *)poVar4," with ");
        sVar1 = (pTStack_18->assertions).passed;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d8,"assertion",&local_2d9);
        pluralise::pluralise(&local_2b8,sVar1,(string *)local_2d8);
        poVar4 = Catch::operator<<((ostream *)poVar3,&local_2b8);
        std::operator<<((ostream *)poVar4,".");
        pluralise::~pluralise(&local_2b8);
        std::__cxx11::string::~string(local_2d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
        pluralise::~pluralise(&local_268);
        std::__cxx11::string::~string(local_288);
        std::allocator<char>::~allocator((allocator<char> *)&local_289);
        std::__cxx11::string::~string((string *)local_240);
        Colour::~Colour((Colour *)(local_240 + 0x26));
      }
      else {
        Colour::Colour(&local_17a,BrightRed);
        poVar3 = std::operator<<((ostream *)(this->super_StreamingReporterBase).stream,"Failed ");
        sVar1 = (pTStack_18->testCases).failed;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c8,"test case",&local_1c9);
        pluralise::pluralise(&local_1a8,sVar1,(string *)local_1c8);
        poVar4 = Catch::operator<<((ostream *)poVar3,&local_1a8);
        poVar3 = std::operator<<((ostream *)poVar4,", failed ");
        sVar1 = (pTStack_18->assertions).failed;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_218,"assertion",&local_219);
        pluralise::pluralise(&local_1f8,sVar1,(string *)local_218);
        poVar4 = Catch::operator<<((ostream *)poVar3,&local_1f8);
        std::operator<<((ostream *)poVar4,".");
        pluralise::~pluralise(&local_1f8);
        std::__cxx11::string::~string(local_218);
        std::allocator<char>::~allocator((allocator<char> *)&local_219);
        pluralise::~pluralise(&local_1a8);
        std::__cxx11::string::~string(local_1c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
        Colour::~Colour(&local_17a);
      }
    }
  }
  return;
}

Assistant:

void printTotals( const Totals& totals ) const {
            if( totals.testCases.total() == 0 ) {
                stream << "No tests ran.";
            }
            else if( totals.testCases.failed == totals.testCases.total() ) {
                Colour colour( Colour::ResultError );
                const std::string qualify_assertions_failed =
                    totals.assertions.failed == totals.assertions.total() ?
                        bothOrAll( totals.assertions.failed ) : "";
                stream <<
                    "Failed " << bothOrAll( totals.testCases.failed )
                              << pluralise( totals.testCases.failed, "test case"  ) << ", "
                    "failed " << qualify_assertions_failed <<
                                 pluralise( totals.assertions.failed, "assertion" ) << ".";
            }
            else if( totals.assertions.total() == 0 ) {
                stream <<
                    "Passed " << bothOrAll( totals.testCases.total() )
                              << pluralise( totals.testCases.total(), "test case" )
                              << " (no assertions).";
            }
            else if( totals.assertions.failed ) {
                Colour colour( Colour::ResultError );
                stream <<
                    "Failed " << pluralise( totals.testCases.failed, "test case"  ) << ", "
                    "failed " << pluralise( totals.assertions.failed, "assertion" ) << ".";
            }
            else {
                Colour colour( Colour::ResultSuccess );
                stream <<
                    "Passed " << bothOrAll( totals.testCases.passed )
                              << pluralise( totals.testCases.passed, "test case"  ) <<
                    " with "  << pluralise( totals.assertions.passed, "assertion" ) << ".";
            }
        }